

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

FileOptions * __thiscall
google::protobuf::FileOptions::operator=(FileOptions *this,FileOptions *from)

{
  bool bVar1;
  Arena *lhs;
  Arena *rhs;
  FileOptions *from_local;
  FileOptions *this_local;
  
  if (this != from) {
    lhs = protobuf::MessageLite::GetArena((MessageLite *)this);
    rhs = protobuf::MessageLite::GetArena((MessageLite *)from);
    bVar1 = internal::CanMoveWithInternalSwap(lhs,rhs);
    if (bVar1) {
      InternalSwap(this,from);
    }
    else {
      CopyFrom(this,from);
    }
  }
  return this;
}

Assistant:

inline FileOptions& operator=(FileOptions&& from) noexcept {
    if (this == &from) return *this;
    if (::google::protobuf::internal::CanMoveWithInternalSwap(GetArena(), from.GetArena())) {
      InternalSwap(&from);
    } else {
      CopyFrom(from);
    }
    return *this;
  }